

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O2

void __thiscall icu_63::TZDBNames::~TZDBNames(TZDBNames *this)

{
  void *in_RSI;
  
  ~TZDBNames(this);
  UMemory::operator_delete((UMemory *)this,in_RSI);
  return;
}

Assistant:

TZDBNames::~TZDBNames() {
    if (fNames != NULL) {
        uprv_free(fNames);
    }
    if (fRegions != NULL) {
        char **p = fRegions;
        for (int32_t i = 0; i < fNumRegions; p++, i++) {
            uprv_free(*p);
        }
        uprv_free(fRegions);
    }
}